

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::
stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
::destroy(stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
          *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  while (this->m_current != this->m_start) {
    this_00 = this->m_current + -1;
    this->m_current = this_00;
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this->m_data,this->m_size << 5);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}